

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execBitImEa<(moira::Instr)30,(moira::Mode)5,(moira::Size)1>(Moira *this,u16 opcode)

{
  u16 uVar1;
  u32 addr;
  u32 uVar2;
  u32 uVar3;
  byte bVar4;
  
  uVar1 = (this->queue).irc;
  readExt(this);
  addr = computeEA<(moira::Mode)5,(moira::Size)1,0ul>(this,opcode & 7);
  uVar2 = readM<(moira::MemSpace)1,(moira::Size)1,0ul>(this,addr);
  bVar4 = (byte)uVar1 & 7;
  (this->reg).sr.z = (uVar2 >> bVar4 & 1) == 0;
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,0ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  writeM<(moira::MemSpace)1,(moira::Size)1,4ul>(this,addr,uVar2 & ~(1 << bVar4));
  return;
}

Assistant:

void
Moira::execBitImEa(u16 opcode)
{
    u8  src = readI<S>();
    int dst = _____________xxx(opcode);

    switch (M)
    {
        case 0:
        {
            src &= 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, src);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(src));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            src &= 0b111;
            u32 ea, data;
            if (!readOp<M,S>(dst, ea, data)) return;

            data = bit<I>(data, src);

            if (I != BTST) {
                prefetch();
                writeM <M, S, POLLIPL> (ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}